

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speculative.cpp
# Opt level: O1

common_speculative * common_speculative_init(llama_context *ctx_dft)

{
  undefined4 uVar1;
  common_speculative *pcVar2;
  llama_model *model;
  common_sampler *pcVar3;
  common_params_sampling params;
  undefined4 local_13c;
  undefined1 local_138 [128];
  pointer local_b8;
  pointer local_a8;
  _Alloc_hider local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  vector<common_grammar_trigger,_std::allocator<common_grammar_trigger>_> local_78;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  pointer local_30;
  pointer local_20;
  
  pcVar2 = (common_speculative *)operator_new(0x60);
  pcVar2->ctx = ctx_dft;
  pcVar2->smpl = (common_sampler *)0x0;
  uVar1 = llama_n_batch(ctx_dft);
  llama_batch_init(&pcVar2->batch,uVar1,0,1);
  (pcVar2->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pcVar2->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pcVar2->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  common_params_sampling::common_params_sampling((common_params_sampling *)local_138);
  local_138[0x65] = false;
  local_138._16_4_ = 10;
  local_13c = 2;
  std::vector<common_sampler_type,std::allocator<common_sampler_type>>::
  _M_assign_aux<common_sampler_type_const*>
            ((vector<common_sampler_type,std::allocator<common_sampler_type>> *)&local_b8,&local_13c
            );
  model = (llama_model *)llama_get_model(ctx_dft);
  pcVar3 = common_sampler_init(model,(common_params_sampling *)local_138);
  pcVar2->smpl = pcVar3;
  if (local_30 != (pointer)0x0) {
    operator_delete(local_30,(long)local_20 - (long)local_30);
  }
  httplib::detail::std::
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  httplib::detail::std::vector<common_grammar_trigger,_std::allocator<common_grammar_trigger>_>::
  ~vector(&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_p != &local_90) {
    operator_delete(local_a0._M_p,local_90._M_allocated_capacity + 1);
  }
  if (local_b8 != (pointer)0x0) {
    operator_delete(local_b8,(long)local_a8 - (long)local_b8);
  }
  httplib::detail::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_138 + 0x68));
  return pcVar2;
}

Assistant:

struct common_speculative * common_speculative_init(
        struct llama_context * ctx_dft) {
    auto * result = new common_speculative {
        /* .ctx    = */ ctx_dft,
        /* .smpl   = */ nullptr,
        /* .batch  = */ llama_batch_init(llama_n_batch(ctx_dft), 0, 1),
        /* .prompt = */ {},
    };

    // TODO: optimize or pass from outside?
#if 0
    {
        common_params_sampling params;
        params.no_perf = false;

        params.top_k = 40;
        params.top_p = 0.9;

        params.samplers = {
            COMMON_SAMPLER_TYPE_TOP_K,
            COMMON_SAMPLER_TYPE_TOP_P,
            COMMON_SAMPLER_TYPE_INFILL,
        };

        result->smpl = common_sampler_init(llama_get_model(ctx_dft), params);
    }
#else
    {
        common_params_sampling params;
        params.no_perf = false;

        params.top_k = 10;

        params.samplers = {
            COMMON_SAMPLER_TYPE_TOP_K,
        };

        result->smpl = common_sampler_init(llama_get_model(ctx_dft), params);
    }
#endif

    return result;
}